

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsScissorTests.cpp
# Opt level: O0

void deqp::gls::Functional::anon_unknown_0::FramebufferClearCase::clearBuffers
               (Functions *gl,Color color,float depth,int stencil)

{
  int local_18;
  float local_14;
  int stencil_local;
  float depth_local;
  Functions *gl_local;
  
  local_18 = stencil;
  local_14 = depth;
  _stencil_local = gl;
  if (color.type == FLOAT) {
    (*gl->clearBufferfv)(0x1800,0,(GLfloat *)&color.field_1);
  }
  else if (color.type == INT) {
    (*gl->clearBufferiv)(0x1800,0,(GLint *)&color.field_1);
  }
  else if (color.type == UINT) {
    (*gl->clearBufferuiv)(0x1800,0,(GLuint *)&color.field_1);
  }
  (*_stencil_local->clearBufferfv)(0x1801,0,&local_14);
  (*_stencil_local->clearBufferiv)(0x1802,0,&local_18);
  return;
}

Assistant:

void FramebufferClearCase::clearBuffers (const glw::Functions& gl, Color color, float depth, int stencil)
{
	switch(color.type)
	{
		case Color::FLOAT:	gl.clearBufferfv (GL_COLOR, 0, color.f); break;
		case Color::INT:	gl.clearBufferiv (GL_COLOR, 0, color.i); break;
		case Color::UINT:	gl.clearBufferuiv(GL_COLOR, 0, color.u); break;
		default:
			DE_ASSERT(false);
	}

	gl.clearBufferfv(GL_DEPTH, 0, &depth);
	gl.clearBufferiv(GL_STENCIL, 0, &stencil);
}